

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUGD20HM303D.cpp
# Opt level: O1

bool __thiscall RTIMUGD20HM303D::setGyroSampleRate(RTIMUGD20HM303D *this)

{
  uint uVar1;
  int iVar2;
  RTIMUSettings *this_00;
  undefined1 auVar3 [16];
  bool bVar4;
  byte bVar5;
  byte data;
  
  this_00 = (this->super_RTIMU).m_settings;
  uVar1 = this_00->m_GD20HM303DGyroSampleRate;
  if ((ulong)uVar1 < 7) {
    iVar2 = *(int *)(&DAT_001236a4 + (ulong)uVar1 * 4);
    bVar5 = (char)uVar1 * '\b';
    (this->super_RTIMU).m_sampleRate = iVar2;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)iVar2;
    (this->super_RTIMU).m_sampleInterval =
         SUB168((ZEXT816(0) << 0x40 | ZEXT816(1000000)) / auVar3,0);
    iVar2 = this_00->m_GD20HM303DGyroBW;
    data = (byte)(0xcf8f4f0f8f4f0f >> (bVar5 & 0x3f));
    if (iVar2 == 3) {
      data = data | 0x30;
    }
    else if (iVar2 == 2) {
      data = data | 0x20;
    }
    else if (iVar2 == 1) {
      data = data | 0x10;
    }
    bVar4 = RTIMUHal::HALWrite(&this_00->super_RTIMUHal,this->m_gyroSlaveAddr,'9',
                               (uchar)(0x10101L >> (bVar5 & 0x3f)),"Failed to set L3GD20H LOW_ODR");
    if (bVar4) {
      bVar4 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                 this->m_gyroSlaveAddr,' ',data,"Failed to set L3GD20H CTRL1");
      return bVar4;
    }
  }
  else {
    fprintf(_stderr,"Illegal L3GD20H sample rate code %d\n");
  }
  return false;
}

Assistant:

bool RTIMUGD20HM303D::setGyroSampleRate()
{
    unsigned char ctrl1;
    unsigned char lowOdr = 0;

    switch (m_settings->m_GD20HM303DGyroSampleRate) {
    case L3GD20H_SAMPLERATE_12_5:
        ctrl1 = 0x0f;
        lowOdr = 1;
        m_sampleRate = 13;
        break;

    case L3GD20H_SAMPLERATE_25:
        ctrl1 = 0x4f;
        lowOdr = 1;
        m_sampleRate = 25;
        break;

    case L3GD20H_SAMPLERATE_50:
        ctrl1 = 0x8f;
        lowOdr = 1;
        m_sampleRate = 50;
        break;

    case L3GD20H_SAMPLERATE_100:
        ctrl1 = 0x0f;
        m_sampleRate = 100;
        break;

    case L3GD20H_SAMPLERATE_200:
        ctrl1 = 0x4f;
        m_sampleRate = 200;
        break;

    case L3GD20H_SAMPLERATE_400:
        ctrl1 = 0x8f;
        m_sampleRate = 400;
        break;

    case L3GD20H_SAMPLERATE_800:
        ctrl1 = 0xcf;
        m_sampleRate = 800;
        break;

    default:
        HAL_ERROR1("Illegal L3GD20H sample rate code %d\n", m_settings->m_GD20HM303DGyroSampleRate);
        return false;
    }

    m_sampleInterval = (uint64_t)1000000 / m_sampleRate;

    switch (m_settings->m_GD20HM303DGyroBW) {
    case L3GD20H_BANDWIDTH_0:
        ctrl1 |= 0x00;
        break;

    case L3GD20H_BANDWIDTH_1:
        ctrl1 |= 0x10;
        break;

    case L3GD20H_BANDWIDTH_2:
        ctrl1 |= 0x20;
        break;

    case L3GD20H_BANDWIDTH_3:
        ctrl1 |= 0x30;
        break;

    }

    if (!m_settings->HALWrite(m_gyroSlaveAddr, L3GD20H_LOW_ODR, lowOdr, "Failed to set L3GD20H LOW_ODR"))
        return false;

    return (m_settings->HALWrite(m_gyroSlaveAddr, L3GD20H_CTRL1, ctrl1, "Failed to set L3GD20H CTRL1"));
}